

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<256U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::operator/=
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,
          uintwide_t<256U,_unsigned_int,_void,_true> *other)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  representation_type *prVar9;
  long lVar10;
  bool bVar11;
  local_unsigned_wide_type a;
  local_unsigned_wide_type b;
  uintwide_t<256U,_unsigned_int,_void,_false> local_58;
  uintwide_t<256U,_unsigned_int,_void,_false> local_38;
  
  if (this == other) {
    (this->values).super_array<unsigned_int,_8UL>.elems[0] = 1;
    prVar9 = &this->values;
    (prVar9->super_array<unsigned_int,_8UL>).elems[1] = 0;
    (prVar9->super_array<unsigned_int,_8UL>).elems[2] = 0;
    (prVar9->super_array<unsigned_int,_8UL>).elems[3] = 0;
    (prVar9->super_array<unsigned_int,_8UL>).elems[4] = 0;
    prVar9 = &this->values;
    (prVar9->super_array<unsigned_int,_8UL>).elems[4] = 0;
    (prVar9->super_array<unsigned_int,_8UL>).elems[5] = 0;
    (prVar9->super_array<unsigned_int,_8UL>).elems[6] = 0;
    (prVar9->super_array<unsigned_int,_8UL>).elems[7] = 0;
  }
  else {
    lVar10 = 0;
    do {
      iVar2 = *(int *)((long)(other->values).super_array<unsigned_int,_8UL>.elems + lVar10);
      if (iVar2 != 0) break;
      bVar11 = lVar10 != 0x1c;
      lVar10 = lVar10 + 4;
    } while (bVar11);
    if (iVar2 == 0) {
      (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[4] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[5] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[6] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[0] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[1] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[2] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[3] = 0xffffffff;
      (this->values).super_array<unsigned_int,_8UL>.elems[7] = 0x7fffffff;
    }
    else {
      uVar3 = (this->values).super_array<unsigned_int,_8UL>.elems[7];
      uVar4 = (other->values).super_array<unsigned_int,_8UL>.elems[7];
      if ((int)(uVar4 | uVar3) < 0) {
        uVar5 = *(ulong *)(this->values).super_array<unsigned_int,_8UL>.elems;
        uVar6 = *(ulong *)((this->values).super_array<unsigned_int,_8UL>.elems + 2);
        uVar7 = *(ulong *)((this->values).super_array<unsigned_int,_8UL>.elems + 4);
        uVar8 = *(ulong *)((this->values).super_array<unsigned_int,_8UL>.elems + 6);
        local_58.values.super_array<unsigned_int,_8UL>.elems[4] = (int)uVar7;
        local_58.values.super_array<unsigned_int,_8UL>.elems[5] = (int)(uVar7 >> 0x20);
        local_58.values.super_array<unsigned_int,_8UL>.elems[6] = (int)uVar8;
        local_58.values.super_array<unsigned_int,_8UL>.elems[7] = (int)(uVar8 >> 0x20);
        local_58.values.super_array<unsigned_int,_8UL>.elems[0] = (int)uVar5;
        local_58.values.super_array<unsigned_int,_8UL>.elems[1] = (int)(uVar5 >> 0x20);
        local_58.values.super_array<unsigned_int,_8UL>.elems[2] = (int)uVar6;
        local_58.values.super_array<unsigned_int,_8UL>.elems[3] = (int)(uVar6 >> 0x20);
        local_38.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
             *(ulong *)((other->values).super_array<unsigned_int,_8UL>.elems + 4);
        local_38.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
             *(ulong *)((other->values).super_array<unsigned_int,_8UL>.elems + 6);
        local_38.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
             *(ulong *)(other->values).super_array<unsigned_int,_8UL>.elems;
        local_38.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
             *(ulong *)((other->values).super_array<unsigned_int,_8UL>.elems + 2);
        if ((int)uVar3 < 0) {
          local_58.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar5 ^ 0xffffffffffffffff;
          local_58.values.super_array<unsigned_int,_8UL>.elems._8_8_ = uVar6 ^ 0xffffffffffffffff;
          local_58.values.super_array<unsigned_int,_8UL>.elems._16_8_ = uVar7 ^ 0xffffffffffffffff;
          local_58.values.super_array<unsigned_int,_8UL>.elems._24_8_ = uVar8 ^ 0xffffffffffffffff;
          lVar10 = 0;
          do {
            piVar1 = (int *)((long)local_58.values.super_array<unsigned_int,_8UL>.elems + lVar10);
            *piVar1 = *piVar1 + 1;
            if (*piVar1 != 0) break;
            bVar11 = lVar10 != 0x1c;
            lVar10 = lVar10 + 4;
          } while (bVar11);
        }
        if ((int)uVar4 < 0) {
          local_38.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
               local_38.values.super_array<unsigned_int,_8UL>.elems._0_8_ ^ 0xffffffffffffffff;
          local_38.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
               local_38.values.super_array<unsigned_int,_8UL>.elems._8_8_ ^ 0xffffffffffffffff;
          local_38.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
               local_38.values.super_array<unsigned_int,_8UL>.elems._16_8_ ^ 0xffffffffffffffff;
          local_38.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
               local_38.values.super_array<unsigned_int,_8UL>.elems._24_8_ ^ 0xffffffffffffffff;
          lVar10 = 0;
          do {
            piVar1 = (int *)((long)local_38.values.super_array<unsigned_int,_8UL>.elems + lVar10);
            *piVar1 = *piVar1 + 1;
            if (*piVar1 != 0) break;
            bVar11 = lVar10 != 0x1c;
            lVar10 = lVar10 + 4;
          } while (bVar11);
        }
        uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_knuth
                  (&local_58,&local_38,(uintwide_t<256U,_unsigned_int,_void,_false> *)0x0);
        if ((int)uVar3 < 0 != (int)uVar4 < 0) {
          local_58.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
               local_58.values.super_array<unsigned_int,_8UL>.elems._0_8_ ^ 0xffffffffffffffff;
          local_58.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
               local_58.values.super_array<unsigned_int,_8UL>.elems._8_8_ ^ 0xffffffffffffffff;
          local_58.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
               local_58.values.super_array<unsigned_int,_8UL>.elems._16_8_ ^ 0xffffffffffffffff;
          local_58.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
               local_58.values.super_array<unsigned_int,_8UL>.elems._24_8_ ^ 0xffffffffffffffff;
          lVar10 = 0;
          do {
            piVar1 = (int *)((long)local_58.values.super_array<unsigned_int,_8UL>.elems + lVar10);
            *piVar1 = *piVar1 + 1;
            if (*piVar1 != 0) break;
            bVar11 = lVar10 != 0x1c;
            lVar10 = lVar10 + 4;
          } while (bVar11);
        }
        *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4) =
             local_58.values.super_array<unsigned_int,_8UL>.elems._16_8_;
        *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6) =
             local_58.values.super_array<unsigned_int,_8UL>.elems._24_8_;
        *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems =
             local_58.values.super_array<unsigned_int,_8UL>.elems._0_8_;
        *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2) =
             local_58.values.super_array<unsigned_int,_8UL>.elems._8_8_;
      }
      else {
        eval_divide_knuth(this,other,(uintwide_t<256U,_unsigned_int,_void,_true> *)0x0);
      }
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }